

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O2

void scan_bitstream(TrackData *trackdata)

{
  Encoding EVar1;
  __normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_> __src;
  __normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_> _Var2;
  bool bVar3;
  Track *this;
  Encoding *pEVar4;
  size_t __n;
  vector<Encoding,_std::allocator<Encoding>_> encodings;
  _Vector_base<Encoding,_std::allocator<Encoding>_> local_98;
  __normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_> local_78;
  reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
  local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 local_5c;
  undefined4 local_54;
  Encoding *local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
  local_48;
  Encoding *local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
  local_38;
  
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (Encoding *)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (Encoding *)0x0;
  if (opt.encoding == Unknown) {
    local_70.current._M_current._0_4_ = scan_bitstream::last_encoding;
    local_70.current._M_current._4_4_ = 1;
    uStack_68 = 4;
    uStack_64 = 5;
    uStack_60 = 10;
    local_5c = 9;
    std::vector<Encoding,std::allocator<Encoding>>::_M_assign_aux<Encoding_const*>
              ((vector<Encoding,std::allocator<Encoding>> *)&local_98,&local_70);
    local_38.current._M_current =
         (__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>)
         (__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>)
         local_98._M_impl.super__Vector_impl_data._M_finish;
    local_40 = local_98._M_impl.super__Vector_impl_data._M_start;
    std::
    find<std::reverse_iterator<__gnu_cxx::__normal_iterator<Encoding*,std::vector<Encoding,std::allocator<Encoding>>>>,Encoding>
              ((reverse_iterator<__gnu_cxx::__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>_>
                *)&local_78,&local_38,(Encoding *)&local_40);
    __src._M_current = local_78._M_current;
    _Var2._M_current = local_78._M_current + -1;
    if (local_78._M_current != local_98._M_impl.super__Vector_impl_data._M_finish) {
      __n = (long)local_98._M_impl.super__Vector_impl_data._M_finish - (long)local_78._M_current;
      local_78._M_current = _Var2._M_current;
      memmove(_Var2._M_current,__src._M_current,__n);
      _Var2._M_current = local_78._M_current;
    }
    local_78._M_current = _Var2._M_current;
    local_98._M_impl.super__Vector_impl_data._M_finish =
         local_98._M_impl.super__Vector_impl_data._M_finish + -1;
    pEVar4 = local_98._M_impl.super__Vector_impl_data._M_start;
    _Var2._M_current = local_98._M_impl.super__Vector_impl_data._M_finish;
    if (scan_bitstream::last_encoding == FM) {
      local_50 = local_98._M_impl.super__Vector_impl_data._M_start;
      local_54 = 1;
      local_48.current._M_current =
           (__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>)
           (__normal_iterator<Encoding_*,_std::vector<Encoding,_std::allocator<Encoding>_>_>)
           local_98._M_impl.super__Vector_impl_data._M_finish;
      std::
      find<std::reverse_iterator<__gnu_cxx::__normal_iterator<Encoding*,std::vector<Encoding,std::allocator<Encoding>>>>,Encoding>
                (&local_70,&local_48,(Encoding *)&local_50);
      pEVar4 = (Encoding *)
               ((long)CONCAT44(local_70.current._M_current._4_4_,
                               (Encoding)local_70.current._M_current) + 4);
      if (pEVar4 != local_98._M_impl.super__Vector_impl_data._M_finish) {
        memmove((void *)CONCAT44(local_70.current._M_current._4_4_,
                                 (Encoding)local_70.current._M_current),pEVar4,
                (long)local_98._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4);
      }
      local_98._M_impl.super__Vector_impl_data._M_finish =
           local_98._M_impl.super__Vector_impl_data._M_finish + -1;
      pEVar4 = local_98._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_current = local_98._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    local_70.current._M_current._0_4_ = opt.encoding;
    std::vector<Encoding,std::allocator<Encoding>>::_M_assign_aux<Encoding_const*>
              ((vector<Encoding,std::allocator<Encoding>> *)&local_98,&local_70);
    pEVar4 = local_98._M_impl.super__Vector_impl_data._M_start;
    _Var2._M_current = local_98._M_impl.super__Vector_impl_data._M_finish;
  }
  do {
    EVar1 = scan_bitstream::last_encoding;
    if (pEVar4 == _Var2._M_current) break;
    EVar1 = *pEVar4;
    switch(EVar1) {
    case MFM:
    case FM:
    case RX02:
      scan_bitstream_mfm_fm(trackdata);
      break;
    case Amiga:
      scan_bitstream_amiga(trackdata);
      break;
    case GCR:
      scan_bitstream_gcr(trackdata);
      break;
    case Ace:
      scan_bitstream_ace(trackdata);
      break;
    case MX:
      scan_bitstream_mx(trackdata);
      break;
    case Agat:
      scan_bitstream_agat(trackdata);
      break;
    case Apple:
      scan_bitstream_apple(trackdata);
      break;
    case Victor:
      scan_bitstream_victor(trackdata);
      break;
    case Vista:
      scan_bitstream_vista(trackdata);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/BitstreamDecoder.cpp"
                    ,0xbb,"void scan_bitstream(TrackData &)");
    }
    this = TrackData::track(trackdata);
    bVar3 = Track::empty(this);
    pEVar4 = pEVar4 + 1;
  } while (bVar3 || opt.multiformat != 0);
  scan_bitstream::last_encoding = EVar1;
  std::_Vector_base<Encoding,_std::allocator<Encoding>_>::~_Vector_base(&local_98);
  return;
}

Assistant:

void scan_bitstream(TrackData& trackdata)
{
    static Encoding last_encoding = Encoding::MFM;

    std::vector<Encoding> encodings;
    if (opt.encoding != Encoding::Unknown)
    {
        // Just the one requested format.
        encodings = { opt.encoding };
    }
    else
    {
        // Scan for formats, starting with the last successful encoding.
        encodings = { last_encoding, Encoding::MFM, Encoding::Amiga, Encoding::GCR, Encoding::Victor, Encoding::Apple };
        encodings.erase(std::next(std::find(encodings.rbegin(), encodings.rend(), last_encoding)).base());

        // MFM and FM use the same scanner, so remove the duplicate
        if (last_encoding == Encoding::FM)
            encodings.erase(std::find(encodings.rbegin(), encodings.rend(), Encoding::MFM).base());
    }

    for (auto encoding : encodings)
    {
        switch (encoding)
        {
        case Encoding::MFM:
        case Encoding::FM:
        case Encoding::RX02:
            scan_bitstream_mfm_fm(trackdata);
            break;

        case Encoding::Amiga:
            scan_bitstream_amiga(trackdata);
            break;

            // Apple Disk ][ GCR
        case Encoding::Apple:
            scan_bitstream_apple(trackdata);
            break;

            // Commodore 64 GCR
        case Encoding::GCR:
            scan_bitstream_gcr(trackdata);
            break;

        case Encoding::Ace:
            scan_bitstream_ace(trackdata);
            break;

        case Encoding::MX:
            scan_bitstream_mx(trackdata);
            break;

        case Encoding::Agat:
            scan_bitstream_agat(trackdata);
            break;

        case Encoding::Victor:
            scan_bitstream_victor(trackdata);
            break;

        case Encoding::Vista:
            scan_bitstream_vista(trackdata);
            break;

        default:
            assert(false);
            break;
        }

        // Stop if we found something and we're not scanning multiple formats.
        if (!trackdata.track().empty() && !opt.multiformat)
        {
            // Remember the encoding so we try it first next time
            last_encoding = encoding;
            break;
        }
    }
}